

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int bb_i2c_zip(int pi,uint SDA,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  int __state;
  int sent;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)inLen;
  ext[0].ptr = inBuf;
  sent = pigpio_command_ext(pi,0x5b,SDA,0,inLen,1,ext,0);
  if (0 < sent) {
    sent = recvMax(pi,outBuf,outLen,sent);
  }
  __state = gCancelState[pi];
  pthread_mutex_unlock((pthread_mutex_t *)(gCmdMutex + pi));
  pthread_setcancelstate(__state,(int *)0x0);
  return sent;
}

Assistant:

int bb_i2c_zip(
   int      pi,
   unsigned SDA,
   char    *inBuf,
   unsigned inLen,
   char    *outBuf,
   unsigned outLen)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=SDA
   p2=0
   p3=inLen
   ## extension ##
   char inBuf[inLen]
   */

   ext[0].size = inLen;
   ext[0].ptr = inBuf;

   bytes = pigpio_command_ext
      (pi, PI_CMD_BI2CZ, SDA, 0, inLen, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, outBuf, outLen, bytes);
   }

   _pmu(pi);

   return bytes;
}